

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<10,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 in_RAX;
  undefined8 *puVar1;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  undefined8 *puVar6;
  int col;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar11;
  undefined4 uVar12;
  float afStack_88 [4];
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  undefined8 uStack_58;
  Mat3 m;
  float local_28 [8];
  undefined8 local_8;
  long lVar10;
  
  local_8 = in_RAX;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &uStack_58;
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar7 = 0;
      auVar8 = _DAT_00a99400;
      do {
        bVar11 = SUB164(auVar8 ^ _DAT_00a99450,4) == -0x80000000 &&
                 SUB164(auVar8 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar3 != lVar7) {
            uVar12 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar7) = uVar12;
        }
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar3 + -0xc != lVar7) {
            uVar12 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar7 + 0xc) = uVar12;
        }
        lVar10 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar10 + 2;
        lVar7 = lVar7 + 0x18;
      } while (lVar7 != 0x30);
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0xc;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
    } while (lVar5 != 3);
    uStack_58 = *(undefined8 *)evalCtx->in[0].m_data;
    m.m_data.m_data[0].m_data[1] = evalCtx->in[1].m_data[0];
    m.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[2];
    m.m_data.m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    m.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    m.m_data.m_data[2].m_data[0] = evalCtx->in[2].m_data[2];
  }
  else {
    puVar1 = &uStack_58;
    m.m_data.m_data[0].m_data[2] = 0.0;
    m.m_data.m_data[1].m_data[0] = 0.0;
    m.m_data.m_data[1].m_data[1] = 0.0;
    m.m_data.m_data[1].m_data[2] = 0.0;
    uStack_58 = 0;
    m.m_data.m_data[0].m_data[0] = 0.0;
    m.m_data.m_data[0].m_data[1] = 0.0;
    m.m_data.m_data[2].m_data[0] = 0.0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat3x3;
    lVar3 = 0;
    do {
      lVar5 = 0;
      puVar6 = puVar1;
      do {
        *(undefined4 *)puVar6 = puVar4[lVar5];
        lVar5 = lVar5 + 1;
        puVar6 = (undefined8 *)((long)puVar6 + 0xc);
      } while (lVar5 != 3);
      lVar3 = lVar3 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar4 = puVar4 + 3;
    } while (lVar3 != 3);
  }
  pfVar2 = local_28;
  local_28[4] = 0.0;
  local_28[5] = 0.0;
  local_28[6] = 0.0;
  local_28[7] = 0.0;
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  local_28[3] = 0.0;
  local_8 = (ulong)local_8._4_4_ << 0x20;
  lVar3 = 0;
  lVar5 = 0;
  do {
    lVar7 = 0;
    auVar9 = _DAT_00a99400;
    do {
      bVar11 = SUB164(auVar9 ^ _DAT_00a99450,4) == -0x80000000 &&
               SUB164(auVar9 ^ _DAT_00a99450,0) < -0x7ffffffd;
      if (bVar11) {
        uVar12 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7) = uVar12;
      }
      if (bVar11) {
        uVar12 = 0x3f800000;
        if (lVar3 + -0xc != lVar7) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7 + 0xc) = uVar12;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x30);
    lVar5 = lVar5 + 1;
    lVar3 = lVar3 + 0xc;
    pfVar2 = pfVar2 + 1;
  } while (lVar5 != 3);
  pfVar2 = local_28;
  puVar1 = &uStack_58;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      *(uint *)((long)pfVar2 + lVar5) = *(uint *)((long)puVar1 + lVar5) ^ (uint)DAT_00a99450;
      lVar5 = lVar5 + 0xc;
    } while (lVar5 != 0x24);
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
  } while (lVar3 != 3);
  stack0xffffffffffffff90 = 0;
  lVar3 = 0;
  do {
    res_1.m_data[lVar3 + 2] = local_28[lVar3] + local_28[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  res_1.m_data[0] = 0.0;
  afStack_88[2] = 0.0;
  afStack_88[3] = 0.0;
  lVar3 = 0;
  do {
    res_1.m_data[lVar3 + -2] = res_1.m_data[lVar3 + 2] + local_28[lVar3 + 6];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)res_1.m_data[lVar3 + 2]] = afStack_88[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}